

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

int av1_get_palette_delta_bits_v(PALETTE_MODE_INFO *pmi,int bit_depth,int *zero_count,int *min_bits)

{
  byte bVar1;
  int iVar2;
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int d;
  int v;
  int delta;
  int i;
  int max_d;
  int max_val;
  int n;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_30;
  undefined4 local_2c;
  
  bVar1 = *(byte *)(in_RDI + 0x31);
  iVar2 = 1 << ((byte)in_ESI & 0x1f);
  local_2c = 0;
  *in_RCX = in_ESI + -4;
  *in_RDX = 0;
  for (local_30 = 1; local_30 < (int)(uint)bVar1; local_30 = local_30 + 1) {
    local_40 = (uint)*(ushort *)(in_RDI + (long)(local_30 + 0x10) * 2) -
               (uint)*(ushort *)(in_RDI + (long)(local_30 + 0xf) * 2);
    if (local_40 < 1) {
      local_40 = -local_40;
    }
    if (iVar2 - local_40 <= local_40) {
      local_40 = iVar2 - local_40;
    }
    if (local_2c < local_40) {
      local_2c = local_40;
    }
    if (local_40 == 0) {
      *in_RDX = *in_RDX + 1;
    }
  }
  iVar2 = av1_ceil_log2(0x598239);
  if (*in_RCX < iVar2) {
    local_44 = av1_ceil_log2(0x59824e);
  }
  else {
    local_44 = *in_RCX;
  }
  return local_44;
}

Assistant:

int av1_get_palette_delta_bits_v(const PALETTE_MODE_INFO *const pmi,
                                 int bit_depth, int *zero_count,
                                 int *min_bits) {
  const int n = pmi->palette_size[1];
  const int max_val = 1 << bit_depth;
  int max_d = 0;
  *min_bits = bit_depth - 4;
  *zero_count = 0;
  for (int i = 1; i < n; ++i) {
    const int delta = pmi->palette_colors[2 * PALETTE_MAX_SIZE + i] -
                      pmi->palette_colors[2 * PALETTE_MAX_SIZE + i - 1];
    const int v = abs(delta);
    const int d = AOMMIN(v, max_val - v);
    if (d > max_d) max_d = d;
    if (d == 0) ++(*zero_count);
  }
  return AOMMAX(av1_ceil_log2(max_d + 1), *min_bits);
}